

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * realloc(void *__ptr,size_t __size)

{
  int iVar1;
  int *piVar2;
  mchunkptr pmVar3;
  void *pvVar4;
  int can_move;
  undefined8 in_RCX;
  size_t in_RDX;
  size_t extraout_RDX;
  ulong __n;
  uint uVar5;
  
  iVar1 = _gm_.mutex;
  can_move = (int)in_RCX;
  if (__ptr == (void *)0x0) {
    pvVar4 = malloc(__size);
    return pvVar4;
  }
  if (__size < 0xffffffffffffff80) {
    pmVar3 = (mchunkptr)&DAT_00000020;
    if (0x16 < __size) {
      pmVar3 = (mchunkptr)(__size + 0x17 & 0xfffffffffffffff0);
    }
    if (((byte)_gm_.mflags & 2) != 0) {
      uVar5 = 1;
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
      if (iVar1 != 0) {
        while (can_move = (int)in_RCX, _gm_.mutex != 0) {
          if ((uVar5 & 0x3f) == 0) {
            sched_yield();
            in_RDX = extraout_RDX;
          }
          uVar5 = uVar5 + 1;
        }
        LOCK();
        _gm_.mutex = 1;
        UNLOCK();
      }
    }
    pmVar3 = try_realloc_chunk((mstate)((long)__ptr + -0x10),pmVar3,in_RDX,can_move);
    if (((byte)_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    if (pmVar3 != (mchunkptr)0x0) {
      return &pmVar3->fd;
    }
    pvVar4 = malloc(__size);
    if (pvVar4 != (void *)0x0) {
      __n = ((ulong)((*(ulong *)((long)__ptr + -8) & 3) != 0) << 3 | 0xfffffffffffffff0) +
            (*(ulong *)((long)__ptr + -8) & 0xfffffffffffffff8);
      if (__size <= __n) {
        __n = __size;
      }
      memcpy(pvVar4,__ptr,__n);
      free(__ptr);
      return pvVar4;
    }
  }
  else {
    piVar2 = _PDCLIB_errno_func();
    *piVar2 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* dlrealloc(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = dlmalloc(bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    dlfree(oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = gm;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = internal_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          internal_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}